

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
Gecko::Graph::order(Graph *this,Functional *functional,uint iterations,uint window,uint period,
                   uint seed,Progress *progress)

{
  undefined4 uVar1;
  uint uVar2;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  int in_R9D;
  Float FVar3;
  Graph *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  Float c;
  uint k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> minperm;
  Float mincost;
  undefined1 in_stack_ffffffffffffff6f;
  Graph *in_stack_ffffffffffffff70;
  byte local_81;
  Graph *in_stack_ffffffffffffff88;
  Graph *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  Graph *in_stack_ffffffffffffffc0;
  float local_30;
  int local_18;
  
  *in_RDI = in_RSI;
  if (in_stack_00000008 == (Graph *)0x0) {
    in_stack_ffffffffffffff88 = (Graph *)operator_new(8);
    Progress::Progress((Progress *)in_stack_ffffffffffffff88);
    in_stack_00000008 = in_stack_ffffffffffffff88;
  }
  in_RDI[1] = in_stack_00000008;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  this_00 = in_stack_00000008;
  while (uVar1 = *(undefined4 *)(in_RDI + 0x11), uVar2 = nodes((Graph *)0x12a6c7),
        (uint)(1 << ((byte)uVar1 & 0x1f)) < uVar2) {
    *(int *)(in_RDI + 0x11) = *(int *)(in_RDI + 0x11) + 1;
  }
  place(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  local_30 = cost((Graph *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffc0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (in_R9D != 0) {
    shuffle(this_00,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  }
  (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &in_stack_00000008->functional)->_M_impl).super__Vector_impl_data._M_start + 4))
            (local_30,in_stack_00000008,in_RDI);
  uVar2 = edges((Graph *)0x12a776);
  if (uVar2 != 0) {
    uVar4 = 1;
    local_18 = in_ECX;
    while( true ) {
      local_81 = 0;
      if (uVar4 <= in_EDX) {
        local_81 = (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &in_stack_00000008->functional)->_M_impl).super__Vector_impl_data.
                                _M_start + 0x10))();
        local_81 = local_81 ^ 0xff;
      }
      if ((local_81 & 1) == 0) break;
      (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &in_stack_00000008->functional)->_M_impl).super__Vector_impl_data._M_start + 8))
                (in_stack_00000008,in_RDI,uVar4,in_EDX,local_18);
      reweight(this_00,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      vcycle(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      FVar3 = cost((Graph *)CONCAT44(in_stack_ffffffffffffffac,uVar4));
      if (FVar3 < local_30) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (in_stack_00000010,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_00000008);
        local_30 = FVar3;
      }
      (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &in_stack_00000008->functional)->_M_impl).super__Vector_impl_data._M_start + 10)
      )(local_30,FVar3,in_stack_00000008,in_RDI);
      if ((in_R8D != 0) && (uVar4 % in_R8D == 0)) {
        local_18 = local_18 + 1;
      }
      uVar4 = uVar4 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (in_stack_00000010,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_00000008);
    place(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  }
  (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &in_stack_00000008->functional)->_M_impl).super__Vector_impl_data._M_start + 6))
            (local_30,in_stack_00000008,in_RDI);
  if (in_stack_00000008 == (Graph *)0x0) {
    if ((long *)in_RDI[1] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[1] + 8))();
    }
    in_RDI[1] = 0;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  return;
}

Assistant:

void
Graph::order(Functional* functional, uint iterations, uint window, uint period, uint seed, Progress* progress)
{
  // Initialize graph.
  this->functional = functional;
  progress = this->progress = progress ? progress : new Progress;
  for (level = 0; (1u << level) < nodes(); level++);
  place();
  Float mincost = cost();
  vector<Node::Index> minperm = perm;
  if (seed)
    shuffle(seed);

  progress->beginorder(this, mincost);
  if (edges()) {
    // Perform specified number of V-cycles.
    for (uint k = 1; k <= iterations && !progress->quit(); k++) {
      progress->beginiter(this, k, iterations, window);
      reweight(k);
      vcycle(window);
      Float c = cost();
      if (c < mincost) { 
        mincost = c;
        minperm = perm;
      }
      progress->enditer(this, mincost, c);
      if (period && !(k % period))
        window++;
    }
    perm = minperm;
    place();
  }
  progress->endorder(this, mincost);

  if (!progress) {
    delete this->progress;
    this->progress = 0;
  }
}